

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocaltime.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_d06ba1::MkTimeResult::MkTimeResult(MkTimeResult *this,tm *prior)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  long lVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  time_t tVar14;
  long in_FS_OFFSET;
  bool bVar15;
  tm local_58;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  (this->local).tm_zone = prior->tm_zone;
  iVar10 = prior->tm_sec;
  iVar11 = prior->tm_min;
  iVar12 = prior->tm_hour;
  iVar13 = prior->tm_mday;
  iVar1 = prior->tm_mon;
  iVar2 = prior->tm_year;
  iVar3 = prior->tm_wday;
  iVar9 = prior->tm_yday;
  uVar8 = *(undefined4 *)&prior->field_0x24;
  lVar5 = prior->tm_gmtoff;
  (this->local).tm_isdst = prior->tm_isdst;
  *(undefined4 *)&(this->local).field_0x24 = uVar8;
  (this->local).tm_gmtoff = lVar5;
  (this->local).tm_mon = iVar1;
  (this->local).tm_year = iVar2;
  (this->local).tm_wday = iVar3;
  (this->local).tm_yday = iVar9;
  (this->local).tm_sec = iVar10;
  (this->local).tm_min = iVar11;
  (this->local).tm_hour = iVar12;
  (this->local).tm_mday = iVar13;
  tVar14 = qMkTime(&this->local);
  this->utcSecs = tVar14;
  bVar15 = true;
  if (tVar14 == -1) {
    iVar1 = (this->local).tm_year;
    if ((0xfffffffd < iVar1 - 0x47U) &&
       ((((long)(this->local).tm_sec - (this->local).tm_gmtoff) +
         ((long)(this->local).tm_min + (long)(this->local).tm_hour * 0x3c) * 0x3c + 1) % 0x15180 ==
        0)) {
      iVar2 = (this->local).tm_mday;
      iVar3 = (this->local).tm_mon;
      if (iVar1 == 0x45) {
        bVar15 = iVar3 < 0xb;
        bVar4 = iVar2 < 0x1f;
      }
      else {
        bVar15 = 0 < iVar3;
        bVar4 = 1 < iVar2;
      }
      if (!bVar4 && !bVar15) {
        uVar6 = (this->local).tm_sec;
        uVar7 = (this->local).tm_min;
        local_58.tm_hour = (this->local).tm_hour;
        local_58.tm_mday = (this->local).tm_mday;
        local_58.tm_mon = (this->local).tm_mon;
        local_58.tm_year = (this->local).tm_year;
        local_58.tm_wday = (this->local).tm_wday;
        local_58.tm_yday = (this->local).tm_yday;
        local_58.tm_isdst = (this->local).tm_isdst;
        local_58._36_4_ = *(undefined4 *)&(this->local).field_0x24;
        local_58.tm_gmtoff = (this->local).tm_gmtoff;
        local_58.tm_zone = (this->local).tm_zone;
        local_58.tm_min = uVar7;
        local_58.tm_sec = uVar6 + -1;
        tVar14 = qMkTime(&local_58);
        if (tVar14 == -2) {
          (this->local).tm_sec = local_58.tm_sec;
          (this->local).tm_min = local_58.tm_min;
          (this->local).tm_hour = local_58.tm_hour;
          (this->local).tm_mday = local_58.tm_mday;
          (this->local).tm_zone = local_58.tm_zone;
          (this->local).tm_isdst = local_58.tm_isdst;
          *(undefined4 *)&(this->local).field_0x24 = local_58._36_4_;
          (this->local).tm_gmtoff = local_58.tm_gmtoff;
          (this->local).tm_mon = local_58.tm_mon;
          (this->local).tm_year = local_58.tm_year;
          (this->local).tm_wday = local_58.tm_wday;
          (this->local).tm_yday = local_58.tm_yday;
          (this->local).tm_sec = (this->local).tm_sec + 1;
        }
        bVar15 = tVar14 == -2;
        goto LAB_003145f8;
      }
    }
    bVar15 = false;
  }
LAB_003145f8:
  this->good = bVar15;
  if ((((prior->tm_year == (this->local).tm_year) && (prior->tm_mon == (this->local).tm_mon)) &&
      (prior->tm_mday == (this->local).tm_mday)) &&
     (((prior->tm_hour == (this->local).tm_hour && (prior->tm_min == (this->local).tm_min)) &&
      (prior->tm_sec == (this->local).tm_sec)))) {
    iVar1 = (this->local).tm_isdst;
    if (prior->tm_isdst == -1) {
      bVar15 = -1 < iVar1;
    }
    else {
      bVar15 = prior->tm_isdst == iVar1;
    }
  }
  else {
    bVar15 = false;
  }
  this->adjusted = (bool)(bVar15 ^ 1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit MkTimeResult(const struct tm &prior)
    : local(prior), utcSecs(qMkTime(&local)),
      good(utcSecs != maybeError || meansEnd1969()),
      adjusted(changed(prior))
    {}